

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O2

void testing::internal::DefaultPrintTo<llvm::StringRef>(long *param_1,ostream *param_2)

{
  char *value;
  long lVar1;
  long lVar2;
  long lVar3;
  
  std::operator<<(param_2,'{');
  lVar1 = *param_1;
  lVar3 = 0;
  lVar2 = lVar1;
  do {
    value = (char *)(lVar1 + lVar3);
    if (value == (char *)(lVar2 + param_1[1])) {
      if (lVar3 != 0) {
LAB_00117446:
        std::operator<<(param_2,' ');
      }
      std::operator<<(param_2,'}');
      return;
    }
    if ((lVar3 != 0) && (std::operator<<(param_2,','), lVar3 == 0x20)) {
      std::operator<<(param_2," ...");
      goto LAB_00117446;
    }
    std::operator<<(param_2,' ');
    UniversalPrinter<char>::Print(value,param_2);
    lVar3 = lVar3 + 1;
    lVar2 = *param_1;
  } while( true );
}

Assistant:

void DefaultPrintTo(WrapPrinterType<kPrintContainer> /* dummy */,
                    const C& container, ::std::ostream* os) {
  const size_t kMaxCount = 32;  // The maximum number of elements to print.
  *os << '{';
  size_t count = 0;
  for (typename C::const_iterator it = container.begin();
       it != container.end(); ++it, ++count) {
    if (count > 0) {
      *os << ',';
      if (count == kMaxCount) {  // Enough has been printed.
        *os << " ...";
        break;
      }
    }
    *os << ' ';
    // We cannot call PrintTo(*it, os) here as PrintTo() doesn't
    // handle *it being a native array.
    internal::UniversalPrint(*it, os);
  }

  if (count > 0) {
    *os << ' ';
  }
  *os << '}';
}